

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

string * sciplot::internal::str<double>(string *__return_storage_ptr__,double *val)

{
  stringstream ss;
  stringstream asStack_198 [128];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<double>(*val);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

auto str(const T& val) -> std::string
{
    std::stringstream ss;
    ss << val;
    return ss.str(); // Note: This is different than std::to_string(i). For example, it works with custom types. Also, std::to_string(2.0) may produce "2.000000", difficulting string comparison in the tests.
}